

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
RecursiveMutexTest_TryLock_Test<yamc::checked::recursive_mutex>::~RecursiveMutexTest_TryLock_Test
          (RecursiveMutexTest_TryLock_Test<yamc::checked::recursive_mutex> *this)

{
  RecursiveMutexTest_TryLock_Test<yamc::checked::recursive_mutex> *this_local;
  
  ~RecursiveMutexTest_TryLock_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(RecursiveMutexTest, TryLock)
{
  TypeParam mtx;
  std::size_t c1 = 0, c2 = 0, c3 = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock()) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk1(mtx, std::adopt_lock);
        ++c1;
        {
          ASSERT_TRUE(mtx.try_lock());
          std::lock_guard<TypeParam> lk2(mtx, std::adopt_lock);
          ++c2;
        }
        ++c3;
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, c1);
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, c2);
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, c3);
}